

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

Buffer * __thiscall Liby::Connection::sync_read(Buffer *__return_storage_ptr__,Connection *this)

{
  Socket *this_00;
  char *pcVar1;
  void *__buf;
  ulong uVar2;
  size_t in_RCX;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  Buffer::Buffer(__return_storage_ptr__,0x1000);
  Socket::setNoblock((this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,false);
  local_38._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:105:23)>
             ::_M_invoke;
  local_58._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:105:23)>
             ::_M_manager;
  local_28 = 0;
  uStack_20 = 0;
  local_58._M_unused._M_object = this;
  local_38._M_unused._M_object = this;
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  this_00 = (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar1 = Buffer::data(__return_storage_ptr__);
  __buf = (void *)Buffer::capacity(__return_storage_ptr__);
  uVar2 = Socket::read(this_00,(int)pcVar1,__buf,in_RCX);
  if (0 < (int)uVar2) {
    Buffer::append(__return_storage_ptr__,uVar2 & 0xffffffff);
  }
  DeferCaller::~DeferCaller((DeferCaller *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

Buffer Connection::sync_read() {
    Buffer ret(4096);
    socket_->setNoblock(false);
    DeferCaller defer([this] { socket_->setNoblock(); });
    int nbytes = socket_->read(static_cast<void *>(ret.data()), ret.capacity());
    if (nbytes > 0) {
        ret.append(nbytes);
    }
    return ret;
}